

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tck-reach.cc
# Opt level: O2

shared_ptr<tchecker::parsing::system_declaration_t> load_system_declaration(string *filename)

{
  runtime_error *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  string *in_RSI;
  shared_ptr<tchecker::parsing::system_declaration_t> sVar1;
  __shared_ptr<tchecker::parsing::system_declaration_t,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  (filename->_M_dataplus)._M_p = (pointer)0x0;
  filename->_M_string_length = 0;
  tchecker::parsing::parse_system_declaration((parsing *)&local_30,in_RSI);
  std::__shared_ptr<tchecker::parsing::system_declaration_t,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<tchecker::parsing::system_declaration_t,_(__gnu_cxx::_Lock_policy)2> *)
             filename,&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  if ((filename->_M_dataplus)._M_p != (pointer)0x0) {
    sVar1.super___shared_ptr<tchecker::parsing::system_declaration_t,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = extraout_RDX._M_pi;
    sVar1.super___shared_ptr<tchecker::parsing::system_declaration_t,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)filename;
    return (shared_ptr<tchecker::parsing::system_declaration_t>)
           sVar1.
           super___shared_ptr<tchecker::parsing::system_declaration_t,_(__gnu_cxx::_Lock_policy)2>;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"nullptr system declaration");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::shared_ptr<tchecker::parsing::system_declaration_t> load_system_declaration(std::string const & filename)
{
  std::shared_ptr<tchecker::parsing::system_declaration_t> sysdecl{nullptr};
  try {
    sysdecl = tchecker::parsing::parse_system_declaration(filename);
    if (sysdecl == nullptr)
      throw std::runtime_error("nullptr system declaration");
  }
  catch (std::exception const & e) {
    std::cerr << tchecker::log_error << e.what() << std::endl;
  }
  return sysdecl;
}